

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_codepoint<8ul,char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,char prefix,uint32_t cp)

{
  char c;
  basic_appender<char> *pbVar1;
  basic_appender<char> bVar2;
  char local_38 [8];
  char buf [8];
  basic_appender<char> local_28;
  uint32_t local_20;
  char local_19;
  uint32_t cp_local;
  char prefix_local;
  basic_appender<char> out_local;
  
  local_20 = cp;
  local_19 = prefix;
  _cp_local = out.container;
  local_28 = basic_appender<char>::operator++((basic_appender<char> *)&cp_local,0);
  pbVar1 = basic_appender<char>::operator*(&local_28);
  basic_appender<char>::operator=(pbVar1,'\\');
  c = local_19;
  buf = (char  [8])basic_appender<char>::operator++((basic_appender<char> *)&cp_local,0);
  pbVar1 = basic_appender<char>::operator*((basic_appender<char> *)buf);
  basic_appender<char>::operator=(pbVar1,c);
  fill_n<char,unsigned_long>(local_38,8,'0');
  format_base2e<char,unsigned_int>(4,local_38,local_20,8,false);
  bVar2 = copy<char,_char_*,_fmt::v11::basic_appender<char>,_0>(local_38,buf,_cp_local);
  return (basic_appender<char>)bVar2.container;
}

Assistant:

auto write_codepoint(OutputIt out, char prefix, uint32_t cp) -> OutputIt {
  *out++ = static_cast<Char>('\\');
  *out++ = static_cast<Char>(prefix);
  Char buf[width];
  fill_n(buf, width, static_cast<Char>('0'));
  format_base2e(4, buf, cp, width);
  return copy<Char>(buf, buf + width, out);
}